

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t __thiscall duckdb::DecryptionTransport::Finalize(DecryptionTransport *this)

{
  undefined8 uVar1;
  ssize_t sVar2;
  EncryptionState *pEVar3;
  long lVar4;
  InternalException *this_00;
  InvalidInputException *this_01;
  size_t in_RDI;
  data_t computed_tag [16];
  shared_ptr<duckdb::EncryptionState,_true> *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  allocator in_stack_ffffffffffffff5f;
  InternalException *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [27];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  if (*(int *)(in_RDI + 0x103c) != *(int *)(in_RDI + 0x1038)) {
    local_3d = 1;
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,
               "DecryptionTransport::Finalize was called with bytes remaining in read buffer: \nread buffer offset: %d, read buffer size: %d"
               ,&local_29);
    InternalException::InternalException<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffff60,
               (string *)
               CONCAT17(in_stack_ffffffffffffff5f,
                        CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),
               (uint)(in_RDI >> 0x20),(uint)in_RDI);
    local_3d = 0;
    __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
  }
  sVar2 = duckdb_apache::thrift::transport::TTransport::read
                    (*(TTransport **)(in_RDI + 0x10),(int)local_58,(void *)0x10,in_RDI);
  *(int *)(in_RDI + 0x1044) = *(int *)(in_RDI + 0x1044) - (int)sVar2;
  pEVar3 = shared_ptr<duckdb::EncryptionState,_true>::operator->(in_stack_ffffffffffffff20);
  lVar4 = (**(code **)(*(long *)pEVar3 + 0x28))(pEVar3,in_RDI + 0x28,0,local_58,0x10);
  if (lVar4 != 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,
               "DecryptionTransport::Finalize was called with bytes remaining in AES context out",
               &local_79);
    duckdb::InternalException::InternalException(this_00,local_78);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  if (*(int *)(in_RDI + 0x1044) != 0) {
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff60,
               "Encoded ciphertext length differs from actual ciphertext length",
               (allocator *)&stack0xffffffffffffff5f);
    duckdb::InvalidInputException::InvalidInputException(this_01,(string *)&stack0xffffffffffffff60)
    ;
    __cxa_throw(this_01,&InvalidInputException::typeinfo,
                InvalidInputException::~InvalidInputException);
  }
  return *(int *)(in_RDI + 0x1040) + 4;
}

Assistant:

uint32_t Finalize() {

		if (read_buffer_offset != read_buffer_size) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in read buffer: \n"
			                        "read buffer offset: %d, read buffer size: %d",
			                        read_buffer_offset, read_buffer_size);
		}

		data_t computed_tag[ParquetCrypto::TAG_BYTES];
		transport_remaining -= trans.read(computed_tag, ParquetCrypto::TAG_BYTES);
		if (aes->Finalize(read_buffer, 0, computed_tag, ParquetCrypto::TAG_BYTES) != 0) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in AES context out");
		}

		if (transport_remaining != 0) {
			throw InvalidInputException("Encoded ciphertext length differs from actual ciphertext length");
		}

		return ParquetCrypto::LENGTH_BYTES + total_bytes;
	}